

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::TriangleMesh::getPrimBounds(TriangleMesh *this,size_t primID)

{
  reference pvVar1;
  size_type in_RDX;
  vec3f *in_RSI;
  box3f *in_RDI;
  box3f *unaff_retaddr;
  box3f *primBounds;
  vec3f *p;
  
  p = in_RSI;
  math::box3f::empty_box();
  pvVar1 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[]
                     ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
                      &in_RSI[0xf].y,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)&in_RSI[9].y,
             (long)pvVar1->x);
  math::box3f::extend(unaff_retaddr,p);
  pvVar1 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[]
                     ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
                      &in_RSI[0xf].y,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)&in_RSI[9].y,
             (long)pvVar1->y);
  math::box3f::extend(unaff_retaddr,p);
  pvVar1 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[]
                     ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
                      &in_RSI[0xf].y,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)&in_RSI[9].y,
             (long)pvVar1->z);
  math::box3f::extend(unaff_retaddr,p);
  return in_RDI;
}

Assistant:

box3f TriangleMesh::getPrimBounds(const size_t primID) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(vertex[index[primID].x]);
    primBounds.extend(vertex[index[primID].y]);
    primBounds.extend(vertex[index[primID].z]);
    return primBounds;
  }